

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O1

NeuralNetworkClassifier *
buildBasicNeuralNetworkClassifierModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringClassLabels,vector<long,_std::allocator<long>_> *intClassLabels,bool includeBias)

{
  RepeatedField<long> *this;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  uint uVar1;
  uint uVar2;
  pointer pbVar3;
  pointer pbVar4;
  ulong uVar5;
  Rep *pRVar6;
  pointer pbVar7;
  pointer pcVar8;
  ConvolutionLayerParams *pCVar9;
  size_t __n;
  undefined4 uVar10;
  Model *pMVar11;
  RepeatedPtrFieldBase *this_01;
  int iVar12;
  int iVar13;
  ModelDescription *pMVar14;
  FeatureType *pFVar15;
  ArrayFeatureType *pAVar16;
  long *plVar17;
  StringFeatureType *pSVar18;
  DictionaryFeatureType *pDVar19;
  NeuralNetworkClassifier *pNVar20;
  StringVector *pSVar21;
  string *psVar22;
  Int64Vector *pIVar23;
  NeuralNetworkLayer *pNVar24;
  InnerProductLayerParams *pIVar25;
  WeightParams *pWVar26;
  NeuralNetworkLayer *pNVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar28;
  void *pvVar29;
  SoftmaxLayerParams *pSVar30;
  undefined1 *puVar31;
  FeatureDescription *pFVar32;
  undefined8 *puVar33;
  Arena *pAVar34;
  pointer pbVar35;
  void **ppvVar36;
  char cVar37;
  long lVar38;
  undefined7 in_register_00000031;
  Arena *pAVar39;
  undefined7 in_register_00000089;
  long tmp;
  long lVar40;
  long lVar41;
  long lVar42;
  initializer_list<long> __l;
  vector<long,_std::allocator<long>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> className;
  allocator_type local_136;
  less<long> local_135;
  undefined4 local_134;
  NeuralNetworkLayer *local_130;
  Model *local_128;
  NeuralNetworkClassifier *local_120;
  undefined4 local_114;
  vector<long,_std::allocator<long>_> *local_110;
  FeatureDescription local_108;
  RepeatedPtrFieldBase *local_d0;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_c8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_98;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_60;
  
  pbVar3 = (stringClassLabels->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (stringClassLabels->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_130 = (NeuralNetworkLayer *)stringClassLabels;
  local_110 = intClassLabels;
  if (m->description_ == (ModelDescription *)0x0) {
    uVar5 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar39 = *(Arena **)pAVar39;
    }
    pMVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar39);
    m->description_ = pMVar14;
  }
  pMVar14 = m->description_;
  pRVar6 = (pMVar14->input_).super_RepeatedPtrFieldBase.rep_;
  local_128 = m;
  if (pRVar6 == (Rep *)0x0) {
LAB_002016bc:
    pFVar32 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar14->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar29 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar14->input_).super_RepeatedPtrFieldBase,pFVar32);
  }
  else {
    iVar13 = (pMVar14->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar13) goto LAB_002016bc;
    (pMVar14->input_).super_RepeatedPtrFieldBase.current_size_ = iVar13 + 1;
    pvVar29 = pRVar6->elements[iVar13];
  }
  pFVar15 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar15,(Arena *)0x0,false);
  if (pFVar15->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar15);
    pFVar15->_oneof_case_[0] = 5;
    uVar5 = (pFVar15->super_MessageLite)._internal_metadata_.ptr_;
    pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar39 = *(Arena **)pAVar39;
    }
    pAVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar39);
    (pFVar15->Type_).multiarraytype_ = pAVar16;
  }
  local_134 = (undefined4)CONCAT71(in_register_00000031,isUpdatable);
  local_114 = (undefined4)CONCAT71(in_register_00000089,includeBias);
  pAVar16 = (pFVar15->Type_).multiarraytype_;
  iVar13 = inTensorAttr->dimension;
  uVar1 = (pAVar16->shape_).current_size_;
  uVar2 = (pAVar16->shape_).total_size_;
  if (uVar1 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar16->shape_,uVar2 + 1);
  }
  plVar17 = google::protobuf::RepeatedField<long>::elements(&pAVar16->shape_);
  plVar17[uVar1] = (long)iVar13;
  (pAVar16->shape_).current_size_ = uVar1 + 1;
  pAVar16->datatype_ = 0x10040;
  puVar33 = (undefined8 *)(*(ulong *)((long)pvVar29 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar29 + 8) & 1) != 0) {
    puVar33 = (undefined8 *)*puVar33;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar29 + 0x10),inTensorAttr->name,puVar33);
  pAVar39 = (Arena *)(*(ulong *)((long)pvVar29 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar29 + 8) & 1) != 0) {
    pAVar39 = *(Arena **)pAVar39;
  }
  if ((pAVar39 == (Arena *)0x0) && (*(long **)((long)pvVar29 + 0x20) != (long *)0x0)) {
    (**(code **)(**(long **)((long)pvVar29 + 0x20) + 8))();
  }
  pAVar34 = (Arena *)(pFVar15->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pAVar34 & 2) == 0) {
    if (((ulong)pAVar34 & 1) != 0) {
      pAVar34 = *(Arena **)((ulong)pAVar34 & 0xfffffffffffffffc);
    }
  }
  else {
    pAVar34 = (Arena *)0x0;
  }
  if (pAVar39 != pAVar34) {
    pFVar15 = (FeatureType *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (pAVar39,(MessageLite *)pFVar15,pAVar34);
  }
  pMVar11 = local_128;
  *(FeatureType **)((long)pvVar29 + 0x20) = pFVar15;
  if (local_128->description_ == (ModelDescription *)0x0) {
    uVar5 = (local_128->super_MessageLite)._internal_metadata_.ptr_;
    pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar39 = *(Arena **)pAVar39;
    }
    pMVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar39);
    pMVar11->description_ = pMVar14;
  }
  pMVar14 = pMVar11->description_;
  pRVar6 = (pMVar14->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_00201847:
    pFVar32 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar14->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar29 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar14->output_).super_RepeatedPtrFieldBase,pFVar32);
  }
  else {
    iVar13 = (pMVar14->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar13) goto LAB_00201847;
    (pMVar14->output_).super_RepeatedPtrFieldBase.current_size_ = iVar13 + 1;
    pvVar29 = pRVar6->elements[iVar13];
  }
  pFVar15 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar15,(Arena *)0x0,false);
  if (pbVar4 == pbVar3) {
    if (pFVar15->_oneof_case_[0] != 1) {
      CoreML::Specification::FeatureType::clear_Type(pFVar15);
      pFVar15->_oneof_case_[0] = 1;
      uVar5 = (pFVar15->super_MessageLite)._internal_metadata_.ptr_;
      pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar39 = *(Arena **)pAVar39;
      }
      pSVar18 = (StringFeatureType *)
                google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64FeatureType>
                          (pAVar39);
      goto LAB_002018e4;
    }
  }
  else if (pFVar15->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar15);
    pFVar15->_oneof_case_[0] = 3;
    uVar5 = (pFVar15->super_MessageLite)._internal_metadata_.ptr_;
    pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar39 = *(Arena **)pAVar39;
    }
    pSVar18 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringFeatureType>
                        (pAVar39);
LAB_002018e4:
    (pFVar15->Type_).stringtype_ = pSVar18;
  }
  puVar33 = (undefined8 *)(*(ulong *)((long)pvVar29 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar29 + 8) & 1) != 0) {
    puVar33 = (undefined8 *)*puVar33;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar29 + 0x10),"predictedClass",puVar33);
  pAVar39 = (Arena *)(*(ulong *)((long)pvVar29 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar29 + 8) & 1) != 0) {
    pAVar39 = *(Arena **)pAVar39;
  }
  if ((pAVar39 == (Arena *)0x0) && (*(long **)((long)pvVar29 + 0x20) != (long *)0x0)) {
    (**(code **)(**(long **)((long)pvVar29 + 0x20) + 8))();
  }
  pAVar34 = (Arena *)(pFVar15->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pAVar34 & 2) == 0) {
    if (((ulong)pAVar34 & 1) != 0) {
      pAVar34 = *(Arena **)((ulong)pAVar34 & 0xfffffffffffffffc);
    }
  }
  else {
    pAVar34 = (Arena *)0x0;
  }
  if (pAVar39 != pAVar34) {
    pFVar15 = (FeatureType *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (pAVar39,(MessageLite *)pFVar15,pAVar34);
  }
  pMVar11 = local_128;
  *(FeatureType **)((long)pvVar29 + 0x20) = pFVar15;
  if (local_128->description_ == (ModelDescription *)0x0) {
    uVar5 = (local_128->super_MessageLite)._internal_metadata_.ptr_;
    pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar39 = *(Arena **)pAVar39;
    }
    pMVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar39);
    pMVar11->description_ = pMVar14;
  }
  pMVar14 = pMVar11->description_;
  pRVar6 = (pMVar14->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_002019af:
    pFVar32 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar14->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar29 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar14->output_).super_RepeatedPtrFieldBase,pFVar32);
  }
  else {
    iVar13 = (pMVar14->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar13) goto LAB_002019af;
    (pMVar14->output_).super_RepeatedPtrFieldBase.current_size_ = iVar13 + 1;
    pvVar29 = pRVar6->elements[iVar13];
  }
  pFVar15 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar15,(Arena *)0x0,false);
  if (pFVar15->_oneof_case_[0] != 6) {
    CoreML::Specification::FeatureType::clear_Type(pFVar15);
    pFVar15->_oneof_case_[0] = 6;
    uVar5 = (pFVar15->super_MessageLite)._internal_metadata_.ptr_;
    pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar39 = *(Arena **)pAVar39;
    }
    pDVar19 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::DictionaryFeatureType>(pAVar39);
    (pFVar15->Type_).dictionarytype_ = pDVar19;
  }
  pDVar19 = (pFVar15->Type_).dictionarytype_;
  if (pbVar4 == pbVar3) {
    if (pDVar19->_oneof_case_[0] != 1) {
      CoreML::Specification::DictionaryFeatureType::clear_KeyType(pDVar19);
      pDVar19->_oneof_case_[0] = 1;
      uVar5 = (pDVar19->super_MessageLite)._internal_metadata_.ptr_;
      pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar39 = *(Arena **)pAVar39;
      }
      pSVar18 = (StringFeatureType *)
                google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64FeatureType>
                          (pAVar39);
      goto LAB_00201a80;
    }
  }
  else if (pDVar19->_oneof_case_[0] != 2) {
    CoreML::Specification::DictionaryFeatureType::clear_KeyType(pDVar19);
    pDVar19->_oneof_case_[0] = 2;
    uVar5 = (pDVar19->super_MessageLite)._internal_metadata_.ptr_;
    pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar39 = *(Arena **)pAVar39;
    }
    pSVar18 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringFeatureType>
                        (pAVar39);
LAB_00201a80:
    (pDVar19->KeyType_).stringkeytype_ = pSVar18;
  }
  puVar33 = (undefined8 *)(*(ulong *)((long)pvVar29 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar29 + 8) & 1) != 0) {
    puVar33 = (undefined8 *)*puVar33;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar29 + 0x10),"classProbabilities",puVar33);
  pAVar39 = (Arena *)(*(ulong *)((long)pvVar29 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar29 + 8) & 1) != 0) {
    pAVar39 = *(Arena **)pAVar39;
  }
  if ((pAVar39 == (Arena *)0x0) && (*(long **)((long)pvVar29 + 0x20) != (long *)0x0)) {
    (**(code **)(**(long **)((long)pvVar29 + 0x20) + 8))();
  }
  pAVar34 = (Arena *)(pFVar15->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pAVar34 & 2) == 0) {
    if (((ulong)pAVar34 & 1) != 0) {
      pAVar34 = *(Arena **)((ulong)pAVar34 & 0xfffffffffffffffc);
    }
  }
  else {
    pAVar34 = (Arena *)0x0;
  }
  if (pAVar39 != pAVar34) {
    pFVar15 = (FeatureType *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (pAVar39,(MessageLite *)pFVar15,pAVar34);
  }
  pMVar11 = local_128;
  *(FeatureType **)((long)pvVar29 + 0x20) = pFVar15;
  if (local_128->description_ == (ModelDescription *)0x0) {
    uVar5 = (local_128->super_MessageLite)._internal_metadata_.ptr_;
    pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar39 = *(Arena **)pAVar39;
    }
    pMVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar39);
    pMVar11->description_ = pMVar14;
  }
  uVar5 = (pMVar11->description_->super_MessageLite)._internal_metadata_.ptr_;
  puVar33 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar33 = (undefined8 *)*puVar33;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pMVar11->description_->predictedfeaturename_,"predictedClass",puVar33);
  if (pMVar11->description_ == (ModelDescription *)0x0) {
    uVar5 = (pMVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar39 = *(Arena **)pAVar39;
    }
    pMVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar39);
    pMVar11->description_ = pMVar14;
  }
  uVar5 = (pMVar11->description_->super_MessageLite)._internal_metadata_.ptr_;
  puVar33 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar33 = (undefined8 *)*puVar33;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pMVar11->description_->predictedprobabilitiesname_,"classProbabilities",puVar33);
  if (pMVar11->_oneof_case_[0] != 0x193) {
    CoreML::Specification::Model::clear_Type(pMVar11);
    pMVar11->_oneof_case_[0] = 0x193;
    uVar5 = (pMVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar39 = *(Arena **)pAVar39;
    }
    pNVar20 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::NeuralNetworkClassifier>(pAVar39);
    (pMVar11->Type_).neuralnetworkclassifier_ = pNVar20;
  }
  pNVar20 = (pMVar11->Type_).neuralnetworkclassifier_;
  if (pbVar4 == pbVar3) {
    pbVar7 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_110->super__Vector_base<long,_std::allocator<long>_>)->_M_impl).
             super__Vector_impl_data._M_finish;
    for (pbVar35 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_110->super__Vector_base<long,_std::allocator<long>_>)->_M_impl).
                   super__Vector_impl_data._M_start; local_120 = pNVar20, pbVar35 != pbVar7;
        pbVar35 = (pointer)&pbVar35->_M_string_length) {
      pcVar8 = (pbVar35->_M_dataplus)._M_p;
      if (pNVar20->_oneof_case_[0] != 0x65) {
        CoreML::Specification::NeuralNetworkClassifier::clear_ClassLabels(pNVar20);
        pNVar20->_oneof_case_[0] = 0x65;
        uVar5 = (pNVar20->super_MessageLite)._internal_metadata_.ptr_;
        pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
        if ((uVar5 & 1) != 0) {
          pAVar39 = *(Arena **)pAVar39;
        }
        pIVar23 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                            (pAVar39);
        (pNVar20->ClassLabels_).int64classlabels_ = pIVar23;
      }
      pIVar23 = (pNVar20->ClassLabels_).int64classlabels_;
      this = &pIVar23->vector_;
      uVar1 = (pIVar23->vector_).current_size_;
      uVar2 = (pIVar23->vector_).total_size_;
      if (uVar1 == uVar2) {
        google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
      }
      plVar17 = google::protobuf::RepeatedField<long>::elements(this);
      plVar17[uVar1] = (long)pcVar8;
      this->current_size_ = uVar1 + 1;
      pNVar20 = local_120;
    }
  }
  else {
    pbVar35 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_130->super_MessageLite)->_M_impl).super__Vector_impl_data._M_start;
    pbVar7 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_130->super_MessageLite)->_M_impl).super__Vector_impl_data._M_finish;
    local_120 = pNVar20;
    if (pbVar35 != pbVar7) {
      do {
        pcVar8 = (pbVar35->_M_dataplus)._M_p;
        local_108.super_MessageLite._vptr_MessageLite = (_func_int **)&local_108.name_;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,pcVar8,pcVar8 + pbVar35->_M_string_length);
        if (pNVar20->_oneof_case_[0] != 100) {
          CoreML::Specification::NeuralNetworkClassifier::clear_ClassLabels(pNVar20);
          pNVar20->_oneof_case_[0] = 100;
          uVar5 = (pNVar20->super_MessageLite)._internal_metadata_.ptr_;
          pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
          if ((uVar5 & 1) != 0) {
            pAVar39 = *(Arena **)pAVar39;
          }
          pSVar21 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                              (pAVar39);
          (pNVar20->ClassLabels_).stringclasslabels_ = pSVar21;
        }
        pSVar21 = (pNVar20->ClassLabels_).stringclasslabels_;
        pRVar6 = (pSVar21->vector_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar6 == (Rep *)0x0) {
LAB_00201c70:
          pbVar28 = google::protobuf::Arena::Create<std::__cxx11::string>
                              ((pSVar21->vector_).super_RepeatedPtrFieldBase.arena_);
          psVar22 = (string *)
                    google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                              (&(pSVar21->vector_).super_RepeatedPtrFieldBase,pbVar28);
        }
        else {
          iVar13 = (pSVar21->vector_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar6->allocated_size <= iVar13) goto LAB_00201c70;
          (pSVar21->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar13 + 1;
          psVar22 = (string *)pRVar6->elements[iVar13];
        }
        std::__cxx11::string::_M_assign(psVar22);
        if ((ArenaStringPtr *)local_108.super_MessageLite._vptr_MessageLite != &local_108.name_) {
          operator_delete(local_108.super_MessageLite._vptr_MessageLite,
                          (long)local_108.name_.tagged_ptr_.ptr_ + 1);
        }
        pbVar35 = pbVar35 + 1;
      } while (pbVar35 != pbVar7);
    }
  }
  this_00 = &pNVar20->layers_;
  pRVar6 = (pNVar20->layers_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_00201d77:
    pNVar27 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar27 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this_00->super_RepeatedPtrFieldBase,pNVar27);
  }
  else {
    iVar13 = (pNVar20->layers_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar13) goto LAB_00201d77;
    (pNVar20->layers_).super_RepeatedPtrFieldBase.current_size_ = iVar13 + 1;
    pNVar27 = (NeuralNetworkLayer *)pRVar6->elements[iVar13];
  }
  uVar5 = (pNVar27->super_MessageLite)._internal_metadata_.ptr_;
  puVar33 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar33 = (undefined8 *)*puVar33;
  }
  local_d0 = &this_00->super_RepeatedPtrFieldBase;
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pNVar27->name_,"inner_product",puVar33);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar27,inTensorAttr->name);
  pRVar6 = (pNVar27->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_00201df6:
    pbVar28 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar27->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar29 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar27->output_).super_RepeatedPtrFieldBase,pbVar28);
  }
  else {
    iVar13 = (pNVar27->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar13) goto LAB_00201df6;
    (pNVar27->output_).super_RepeatedPtrFieldBase.current_size_ = iVar13 + 1;
    pvVar29 = pRVar6->elements[iVar13];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar29,0,*(char **)((long)pvVar29 + 8),0x3bd0c2);
  pNVar24 = local_130;
  if (pbVar4 == pbVar3) {
    pNVar24 = (NeuralNetworkLayer *)local_110;
  }
  pbVar35 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&((vector<long,_std::allocator<long>_> *)pNVar24)->
                  super__Vector_base<long,_std::allocator<long>_>)->_M_impl).super__Vector_impl_data
            ._M_start;
  pbVar7 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&((vector<long,_std::allocator<long>_> *)pNVar24)->
                 super__Vector_base<long,_std::allocator<long>_>)->_M_impl).super__Vector_impl_data.
           _M_finish;
  lVar40 = (long)pbVar7 - (long)pbVar35 >> (pbVar4 != pbVar3) * '\x02' + 3;
  iVar13 = inTensorAttr->dimension;
  if (pNVar27->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar27);
    pNVar27->_oneof_case_[0] = 0x8c;
    uVar5 = (pNVar27->super_MessageLite)._internal_metadata_.ptr_;
    pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar39 = *(Arena **)pAVar39;
    }
    pIVar25 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::InnerProductLayerParams>(pAVar39);
    (pNVar27->layer_).innerproduct_ = pIVar25;
  }
  pCVar9 = (pNVar27->layer_).convolution_;
  *(long *)&pCVar9->_kernelsize_cached_byte_size_ = (long)iVar13;
  (pCVar9->stride_).current_size_ = (int)lVar40;
  (pCVar9->stride_).total_size_ = (int)((ulong)lVar40 >> 0x20);
  lVar38._0_4_ = (pCVar9->kernelsize_).current_size_;
  lVar38._4_4_ = (pCVar9->kernelsize_).total_size_;
  if (lVar38 == 0) {
    uVar5 = (pCVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar39 = *(Arena **)pAVar39;
    }
    pWVar26 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                        (pAVar39);
    *(WeightParams **)&pCVar9->kernelsize_ = pWVar26;
  }
  lVar38 = *(long *)&pCVar9->kernelsize_;
  local_108.super_MessageLite._vptr_MessageLite =
       (_func_int **)((ulong)local_108.super_MessageLite._vptr_MessageLite & 0xffffffff00000000);
  local_130 = pNVar27;
  google::protobuf::RepeatedField<float>::Resize
            ((RepeatedField<float> *)(lVar38 + 0x10),iVar13 * (int)lVar40,(float *)&local_108);
  if (iVar13 != 0) {
    lVar38 = *(long *)(lVar38 + 0x18);
    lVar42 = 0;
    do {
      if (pbVar7 != pbVar35) {
        lVar41 = 0;
        do {
          iVar12 = rand();
          *(float *)(lVar38 + lVar41 * 4) = (float)iVar12 * 4.656613e-10;
          lVar41 = lVar41 + 1;
        } while (lVar40 != lVar41);
      }
      lVar42 = lVar42 + 1;
      lVar38 = lVar38 + lVar40 * 4;
    } while (lVar42 != iVar13);
  }
  pMVar11 = local_128;
  cVar37 = (char)local_114;
  if (cVar37 != '\0') {
    *(undefined1 *)&(pCVar9->stride_).arena_or_elements_ = 1;
    if ((pCVar9->kernelsize_).arena_or_elements_ == (void *)0x0) {
      uVar5 = (pCVar9->super_MessageLite)._internal_metadata_.ptr_;
      pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar39 = *(Arena **)pAVar39;
      }
      pWVar26 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar39);
      (pCVar9->kernelsize_).arena_or_elements_ = pWVar26;
    }
    pvVar29 = (pCVar9->kernelsize_).arena_or_elements_;
    local_108.super_MessageLite._vptr_MessageLite =
         (_func_int **)((ulong)local_108.super_MessageLite._vptr_MessageLite & 0xffffffff00000000);
    google::protobuf::RepeatedField<float>::Resize
              ((RepeatedField<float> *)((long)pvVar29 + 0x10),(int)lVar40,(float *)&local_108);
    if (pbVar7 != pbVar35) {
      lVar38 = *(long *)((long)pvVar29 + 0x18);
      lVar42 = 0;
      do {
        iVar13 = rand();
        *(float *)(lVar38 + lVar42 * 4) = (float)iVar13 * 4.656613e-10;
        lVar42 = lVar42 + 1;
      } while (lVar40 != lVar42);
    }
  }
  this_01 = local_d0;
  pRVar6 = (local_120->layers_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_00201ffe:
    pNVar27 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        (local_d0->arena_);
    pNVar27 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper(this_01,pNVar27);
  }
  else {
    iVar13 = (local_120->layers_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar13) goto LAB_00201ffe;
    (local_120->layers_).super_RepeatedPtrFieldBase.current_size_ = iVar13 + 1;
    pNVar27 = (NeuralNetworkLayer *)pRVar6->elements[iVar13];
  }
  uVar5 = (pNVar27->super_MessageLite)._internal_metadata_.ptr_;
  puVar33 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar33 = (undefined8 *)*puVar33;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar27->name_,"softmax",puVar33);
  pRVar6 = (pNVar27->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_0020205e:
    pbVar28 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar27->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar29 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar27->input_).super_RepeatedPtrFieldBase,pbVar28);
  }
  else {
    iVar13 = (pNVar27->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar13) goto LAB_0020205e;
    (pNVar27->input_).super_RepeatedPtrFieldBase.current_size_ = iVar13 + 1;
    pvVar29 = pRVar6->elements[iVar13];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar29,0,*(char **)((long)pvVar29 + 8),0x3bd0c2);
  pRVar6 = (pNVar27->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 != (Rep *)0x0) {
    iVar13 = (pNVar27->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar13 < pRVar6->allocated_size) {
      (pNVar27->output_).super_RepeatedPtrFieldBase.current_size_ = iVar13 + 1;
      pvVar29 = pRVar6->elements[iVar13];
      goto LAB_002020c9;
    }
  }
  pbVar28 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar27->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar29 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar27->output_).super_RepeatedPtrFieldBase,pbVar28);
LAB_002020c9:
  uVar10 = local_134;
  std::__cxx11::string::_M_replace((ulong)pvVar29,0,*(char **)((long)pvVar29 + 8),0x3bd0d5);
  if (pNVar27->_oneof_case_[0] != 0xaf) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar27);
    pNVar27->_oneof_case_[0] = 0xaf;
    uVar5 = (pNVar27->super_MessageLite)._internal_metadata_.ptr_;
    pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar39 = *(Arena **)pAVar39;
    }
    pSVar30 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SoftmaxLayerParams>
                        (pAVar39);
    (pNVar27->layer_).softmax_ = pSVar30;
  }
  if ((char)uVar10 != '\0') {
    pMVar11->isupdatable_ = true;
    local_130->isupdatable_ = true;
    lVar40._0_4_ = (pCVar9->kernelsize_).current_size_;
    lVar40._4_4_ = (pCVar9->kernelsize_).total_size_;
    if (lVar40 == 0) {
      uVar5 = (pCVar9->super_MessageLite)._internal_metadata_.ptr_;
      pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar39 = *(Arena **)pAVar39;
      }
      pWVar26 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar39);
      *(WeightParams **)&pCVar9->kernelsize_ = pWVar26;
    }
    *(undefined1 *)(*(long *)&pCVar9->kernelsize_ + 0x40) = 1;
    if (cVar37 != '\0') {
      if ((pCVar9->kernelsize_).arena_or_elements_ == (void *)0x0) {
        uVar5 = (pCVar9->super_MessageLite)._internal_metadata_.ptr_;
        pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
        if ((uVar5 & 1) != 0) {
          pAVar39 = *(Arena **)pAVar39;
        }
        pWVar26 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                            (pAVar39);
        (pCVar9->kernelsize_).arena_or_elements_ = pWVar26;
      }
      *(undefined1 *)((long)(pCVar9->kernelsize_).arena_or_elements_ + 0x40) = 1;
    }
    pNVar20 = local_120;
    addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetworkClassifier>
              (pMVar11,local_120,"cross_entropy_loss","scoreVector","target");
    addLearningRate<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar20,kSgdOptimizer,0.699999988079071,0.0,1.0);
    local_108.name_.tagged_ptr_.ptr_ =
         (TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(void *)0x40;
    local_108.shortdescription_.tagged_ptr_.ptr_ =
         (TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(void *)0x80;
    local_108.super_MessageLite._vptr_MessageLite = (_func_int **)0x10;
    local_108.super_MessageLite._internal_metadata_.ptr_ = 0x20;
    __l._M_len = 4;
    __l._M_array = (iterator)&local_108;
    std::set<long,_std::less<long>,_std::allocator<long>_>::set
              ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_60,__l,&local_135,
               &local_136);
    addMiniBatchSize<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar20,kSgdOptimizer,0x20,1,100,
               (set<long,_std::less<long>,_std::allocator<long>_> *)&local_60);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_60);
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl._0_8_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    addEpochs<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar20,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_98);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_98);
    local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_c8._M_impl.super__Rb_tree_header._M_header;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c8._M_impl._0_8_ = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
    addShuffleAndSeed<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar20,0x7e3,0,0x7e3,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_c8)
    ;
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_c8);
    if (pMVar11->description_ == (ModelDescription *)0x0) {
      uVar5 = (pMVar11->super_MessageLite)._internal_metadata_.ptr_;
      pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar39 = *(Arena **)pAVar39;
      }
      pMVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                          (pAVar39);
      pMVar11->description_ = pMVar14;
    }
    google::protobuf::internal::RepeatedPtrFieldBase::
    Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
              (&(pMVar11->description_->traininginput_).super_RepeatedPtrFieldBase);
    puVar31 = (undefined1 *)pMVar11->description_;
    if ((ModelDescription *)puVar31 == (ModelDescription *)0x0) {
      puVar31 = CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar6 = (((ModelDescription *)puVar31)->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar36 = pRVar6->elements;
    if (pRVar6 == (Rep *)0x0) {
      ppvVar36 = (void **)0x0;
    }
    lVar40 = (long)(((ModelDescription *)puVar31)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar40 != 0) {
      lVar38 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  (&local_108,*(FeatureDescription **)((long)ppvVar36 + lVar38));
        if (pMVar11->description_ == (ModelDescription *)0x0) {
          uVar5 = (pMVar11->super_MessageLite)._internal_metadata_.ptr_;
          pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
          if ((uVar5 & 1) != 0) {
            pAVar39 = *(Arena **)pAVar39;
          }
          pMVar14 = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::ModelDescription>(pAVar39);
          pMVar11->description_ = pMVar14;
        }
        pMVar14 = pMVar11->description_;
        pRVar6 = (pMVar14->traininginput_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar6 == (Rep *)0x0) {
LAB_002023ac:
          pFVar32 = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                              ((pMVar14->traininginput_).super_RepeatedPtrFieldBase.arena_);
          pFVar32 = (FeatureDescription *)
                    google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                              (&(pMVar14->traininginput_).super_RepeatedPtrFieldBase,pFVar32);
        }
        else {
          iVar13 = (pMVar14->traininginput_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar6->allocated_size <= iVar13) goto LAB_002023ac;
          (pMVar14->traininginput_).super_RepeatedPtrFieldBase.current_size_ = iVar13 + 1;
          pFVar32 = (FeatureDescription *)pRVar6->elements[iVar13];
        }
        CoreML::Specification::FeatureDescription::CopyFrom(pFVar32,&local_108);
        CoreML::Specification::FeatureDescription::~FeatureDescription(&local_108);
        lVar38 = lVar38 + 8;
      } while (lVar40 * 8 != lVar38);
    }
    puVar31 = (undefined1 *)pMVar11->description_;
    if ((ModelDescription *)puVar31 == (ModelDescription *)0x0) {
      puVar31 = CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar6 = (((ModelDescription *)puVar31)->output_).super_RepeatedPtrFieldBase.rep_;
    ppvVar36 = pRVar6->elements;
    if (pRVar6 == (Rep *)0x0) {
      ppvVar36 = (void **)0x0;
    }
    lVar40 = (long)(((ModelDescription *)puVar31)->output_).super_RepeatedPtrFieldBase.current_size_
    ;
    if (lVar40 != 0) {
      lVar38 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  (&local_108,*(FeatureDescription **)((long)ppvVar36 + lVar38));
        pMVar14 = pMVar11->description_;
        puVar31 = (undefined1 *)pMVar14;
        if (pMVar14 == (ModelDescription *)0x0) {
          puVar31 = CoreML::Specification::_ModelDescription_default_instance_;
        }
        puVar33 = (undefined8 *)
                  ((ulong)(((ModelDescription *)puVar31)->predictedfeaturename_).tagged_ptr_.ptr_ &
                  0xfffffffffffffffe);
        __n = ((undefined8 *)((ulong)local_108.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffe))[1];
        if ((__n == puVar33[1]) &&
           ((__n == 0 ||
            (iVar13 = bcmp(*(void **)((ulong)local_108.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                           (void *)*puVar33,__n), iVar13 == 0)))) {
          if (pMVar14 == (ModelDescription *)0x0) {
            uVar5 = (pMVar11->super_MessageLite)._internal_metadata_.ptr_;
            pAVar39 = (Arena *)(uVar5 & 0xfffffffffffffffc);
            if ((uVar5 & 1) != 0) {
              pAVar39 = *(Arena **)pAVar39;
            }
            pMVar14 = google::protobuf::Arena::
                      CreateMaybeMessage<CoreML::Specification::ModelDescription>(pAVar39);
            pMVar11->description_ = pMVar14;
          }
          pMVar14 = pMVar11->description_;
          pRVar6 = (pMVar14->traininginput_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar6 == (Rep *)0x0) {
LAB_002024bb:
            pFVar32 = google::protobuf::Arena::
                      CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                                ((pMVar14->traininginput_).super_RepeatedPtrFieldBase.arena_);
            pFVar32 = (FeatureDescription *)
                      google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                (&(pMVar14->traininginput_).super_RepeatedPtrFieldBase,pFVar32);
          }
          else {
            iVar13 = (pMVar14->traininginput_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar6->allocated_size <= iVar13) goto LAB_002024bb;
            (pMVar14->traininginput_).super_RepeatedPtrFieldBase.current_size_ = iVar13 + 1;
            pFVar32 = (FeatureDescription *)pRVar6->elements[iVar13];
          }
          CoreML::Specification::FeatureDescription::CopyFrom(pFVar32,&local_108);
        }
        CoreML::Specification::FeatureDescription::~FeatureDescription(&local_108);
        lVar38 = lVar38 + 8;
      } while (lVar40 * 8 != lVar38);
    }
  }
  return local_120;
}

Assistant:

Specification::NeuralNetworkClassifier* buildBasicNeuralNetworkClassifierModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, std::vector<std::string> stringClassLabels, std::vector<int64_t> intClassLabels, bool includeBias) {
    
    bool usesStringClassLabels = stringClassLabels.size() > 0;
    
    auto input = m.mutable_description()->add_input();
    auto inputType = new Specification::FeatureType;
    auto multiArray = inputType->mutable_multiarraytype();
    multiArray->mutable_shape()->Add(inTensorAttr->dimension);
    multiArray->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_DOUBLE);
    input->set_name(inTensorAttr->name);
    input->set_allocated_type(inputType);
    
    auto output = m.mutable_description()->add_output();
    auto outputType = new Specification::FeatureType;
    if (usesStringClassLabels) {
        outputType->mutable_stringtype();
    } else {
        outputType->mutable_int64type();
    }
    
    output->set_name("predictedClass");
    output->set_allocated_type(outputType);
    
    output = m.mutable_description()->add_output();
    outputType = new Specification::FeatureType;
    auto dictionary = outputType->mutable_dictionarytype();
    if (usesStringClassLabels) {
        dictionary->mutable_stringkeytype();
    } else {
        dictionary->mutable_int64keytype();
    }
    
    output->set_name("classProbabilities");
    output->set_allocated_type(outputType);

    m.mutable_description()->set_predictedfeaturename("predictedClass");
    m.mutable_description()->set_predictedprobabilitiesname("classProbabilities");
    
    auto classifier = m.mutable_neuralnetworkclassifier();
    
    if (usesStringClassLabels) {
        for (auto className : stringClassLabels) {
            classifier->mutable_stringclasslabels()->add_vector(className);
        }
    } else {
        for (auto className : intClassLabels) {
            classifier->mutable_int64classlabels()->add_vector(className);
        }
    }
    
    // Add inner product layer
    auto innerProductLayer = classifier->add_layers();
    innerProductLayer->set_name("inner_product");
    innerProductLayer->add_input(inTensorAttr->name);
    innerProductLayer->add_output("intermediateOutput");
    
    uint64_t C_in = (uint64_t)inTensorAttr->dimension;
    uint64_t C_out = 0;
    
    if (usesStringClassLabels) {
        C_out = (uint64_t)stringClassLabels.size();
    } else {
        C_out = (uint64_t)intClassLabels.size();
    }
    
    auto innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(C_in);
    innerProductParams->set_outputchannels(C_out);
    
    ::google::protobuf::RepeatedField<float>* weightsWrite = innerProductParams->mutable_weights()->mutable_floatvalue();
    weightsWrite->Resize((int)C_in * (int)C_out, 0.0);
    float *destination_weights = weightsWrite->mutable_data();
    for (uint64_t i = 0; i < C_in; i++) {
        for (uint64_t j = 0; j < C_out; j++) {
            float random = float(rand())/float(RAND_MAX);
            destination_weights[i * C_out + j] = random;
        }
    }
    
    if (includeBias) {
        innerProductParams->set_hasbias(true);
        
        ::google::protobuf::RepeatedField<float>* biasWrite = innerProductParams->mutable_bias()->mutable_floatvalue();
        biasWrite->Resize((int)1 * (int)C_out, 0.0);
        float *destination_bias = biasWrite->mutable_data();
        for (uint64_t i = 0; i < 1; i++) {
            for (uint64_t j = 0; j < C_out; j++) {
                float random = float(rand())/float(RAND_MAX);
                destination_bias[i * C_out + j] = random;
            }
        }
    }
    
    // Add inner product layer
    auto softmaxLayer = classifier->add_layers();
    softmaxLayer->set_name("softmax");
    softmaxLayer->add_input("intermediateOutput");
    softmaxLayer->add_output("scoreVector");
    softmaxLayer->mutable_softmax();
    
    if (isUpdatable) {
        m.set_isupdatable(true);
        innerProductLayer->set_isupdatable(true);
        innerProductParams->mutable_weights()->set_isupdatable(true);
        
        if (includeBias) {
            innerProductParams->mutable_bias()->set_isupdatable(true);
        }
        
        addCategoricalCrossEntropyLoss(m, classifier, "cross_entropy_loss", "scoreVector", "target");
        
        addLearningRate(classifier, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
        addMiniBatchSize(classifier, Specification::Optimizer::kSgdOptimizer, 32, 1, 100, {16, 32, 64, 128});
        addEpochs(classifier, 100, 1, 100, std::set<int64_t>());
        addShuffleAndSeed(classifier, 2019, 0, 2019, std::set<int64_t>());

        m.mutable_description()->clear_traininginput();
        
        for (auto feature : m.description().input()) {
            auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
            trainingInput->CopyFrom(feature);
        }
        for (auto feature : m.description().output()) {
            if (feature.name() == m.description().predictedfeaturename()) {
                auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
                trainingInput->CopyFrom(feature);
            }
        }
    }
    
    return classifier;
}